

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void pg::freeze_thaw_reset_rec_SYNC_SLOW(WorkerP *w,Task *__dq_head)

{
  Worker *pWVar1;
  int iVar2;
  ulong uVar3;
  size_t diff;
  Task *t_1;
  Worker *wt;
  TD_freeze_thaw_reset_rec *t;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  if (w->allstolen == '\0') {
    if (__dq_head < w->split) {
      iVar2 = lace_shrink_shared(w);
      if (iVar2 != 0) goto LAB_002046c6;
    }
    pWVar1 = w->_public;
    if (pWVar1->movesplit != '\0') {
      uVar3 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
      w->split = w->split + uVar3;
      std::__atomic_base<unsigned_int>::operator+=
                (&(pWVar1->ts).ts.split.super___atomic_base<unsigned_int>,(__int_type_conflict)uVar3
                );
      pWVar1->movesplit = '\0';
    }
    std::atomic_store_explicit<_Worker*>
              (&__dq_head->thief,(__atomic_val_t<_Worker_*>)0x0,memory_order_relaxed);
    freeze_thaw_reset_rec_CALL
              (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
               *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
  }
  else {
LAB_002046c6:
    lace_leapfrog(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}